

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmTarget *this_00;
  cmMakefile *pcVar1;
  auto_ptr<cmCompiledGeneratorExpression> this_01;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  long lVar7;
  _Alloc_hider _Var8;
  allocator local_259;
  string prepro;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string local_210;
  string exportDirs;
  string dirs;
  string includes;
  
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x1a8,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  this_00 = tei->Target;
  std::__cxx11::string::string
            ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&dirs);
  pcVar3 = cmTarget::GetProperty(this_00,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)0x0);
  cmGeneratorExpression::Preprocess(&dirs,&tei->InterfaceIncludeDirectories,InstallInterface,true);
  (*this->_vptr_cmExportFileGenerator[5])(this,&dirs);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&includes,(string *)&ge);
  cge.x_ = (cmCompiledGeneratorExpression *)includes._M_dataplus;
  includes._M_dataplus._M_p = (pointer)0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&includes);
  this_01 = cge;
  pcVar1 = this_00->Makefile;
  std::__cxx11::string::string((string *)&includes,"",(allocator *)&local_210);
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     (this_01.x_,pcVar1,&includes,false,this_00,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&prepro);
  std::__cxx11::string::string((string *)&exportDirs,pcVar4,&local_259);
  std::__cxx11::string::~string((string *)&prepro);
  std::__cxx11::string::~string((string *)&includes);
  if ((cge.x_)->HadContextSensitiveCondition == true) {
    pcVar1 = this_00->Makefile;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    poVar5 = std::operator<<((ostream *)&includes,"Target \"");
    poVar5 = std::operator<<(poVar5,(string *)&this_00->Name);
    std::operator<<(poVar5,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    goto LAB_002f49f2;
  }
  if (pcVar3 == (char *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_002f49f2;
LAB_002f4807:
    includes._M_dataplus._M_p = (pointer)0x0;
    includes._M_string_length = 0;
    includes.field_2._M_allocated_capacity = 0;
    cmGeneratorExpression::Split
              (&exportDirs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includes);
    std::__cxx11::string::assign((char *)&exportDirs);
    for (_Var8 = includes._M_dataplus; _Var8._M_p != (pointer)includes._M_string_length;
        _Var8._M_p = _Var8._M_p + 0x20) {
      std::__cxx11::string::append((char *)&exportDirs);
      bVar2 = cmsys::SystemTools::FileIsFullPath(*(char **)_Var8._M_p);
      if (!bVar2) {
        lVar7 = std::__cxx11::string::find(_Var8._M_p,0x47b25b);
        if (lVar7 == -1) {
          std::__cxx11::string::append((char *)&exportDirs);
        }
      }
      std::__cxx11::string::append((string *)&exportDirs);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes);
    pcVar4 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar4 = "";
    }
    std::__cxx11::string::string((string *)&includes,pcVar4,(allocator *)&prepro);
    pcVar4 = ";";
    if (pcVar3 == (char *)0x0) {
      pcVar4 = "";
    }
    std::operator+(&prepro,pcVar4,&exportDirs);
    std::__cxx11::string::append((string *)&includes);
    std::__cxx11::string::~string((string *)&prepro);
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpressions(this,&prepro,this_00,missingTargets,NoReplaceFreeTargets)
      ;
      std::__cxx11::string::string((string *)&local_210,"INTERFACE_INCLUDE_DIRECTORIES",&local_259);
      bVar2 = checkInterfaceDirs(&prepro,this_00,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_210,"INTERFACE_INCLUDE_DIRECTORIES",&local_259);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_210);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        std::__cxx11::string::~string((string *)&local_210);
      }
    }
    std::__cxx11::string::~string((string *)&prepro);
  }
  else {
    if ((*pcVar3 != '\0') || (exportDirs._M_string_length != 0)) goto LAB_002f4807;
    std::__cxx11::string::string
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator *)&prepro);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&includes);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  std::__cxx11::string::~string((string *)&includes);
LAB_002f49f2:
  std::__cxx11::string::~string((string *)&exportDirs);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  std::__cxx11::string::~string((string *)&dirs);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
                      cmTargetExport *tei,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  cmTarget *target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char *propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char *input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
                                            tei->InterfaceIncludeDirectories,
                                            preprocessRule,
                                            true);
  this->ReplaceInstallPrefix(dirs);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs = cge->Evaluate(target->GetMakefile(), "",
                                         false, target);

  if (cge->GetHadContextSensitiveCondition())
    {
    cmMakefile* mf = target->GetMakefile();
    std::ostringstream e;
    e << "Target \"" << target->GetName() << "\" is installed with "
    "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
    "depend on the configuration, policy values or the link interface are "
    "not supported.  Consider using target_include_directories instead.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }

  if (!input && exportDirs.empty())
    {
    return;
    }
  if ((input && !*input) && exportDirs.empty())
    {
    // Set to empty
    properties[propName] = "";
    return;
    }

  prefixItems(exportDirs);

  std::string includes = (input?input:"");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro = cmGeneratorExpression::Preprocess(includes,
                                                         preprocessRule,
                                                         true);
  if (!prepro.empty())
    {
    this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName))
      {
      return;
      }
    properties[propName] = prepro;
    }
}